

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

PalEntry __thiscall APowerStrength::GetBlend(APowerStrength *this)

{
  int iVar1;
  int cnt;
  APowerStrength *this_local;
  
  iVar1 = -(*(int *)&(this->super_APowerup).super_AInventory.field_0x4dc >> 6);
  if (iVar1 + 0xc < 1) {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),0);
  }
  else {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),
                       (BYTE)((long)(int)((uint)(this->super_APowerup).BlendColor.field_0.field_0.a
                                          * (iVar1 + 0x13 >> 3) * 0xff) / 9),
                       (this->super_APowerup).BlendColor.field_0.field_0.r,
                       (this->super_APowerup).BlendColor.field_0.field_0.g,
                       (this->super_APowerup).BlendColor.field_0.field_0.b);
  }
  return (anon_union_4_2_12391d7c_for_PalEntry_0)
         (anon_union_4_2_12391d7c_for_PalEntry_0)this_local._4_4_;
}

Assistant:

PalEntry APowerStrength::GetBlend ()
{
	// slowly fade the berserk out
	int cnt = 12 - (EffectTics >> 6);

	if (cnt > 0)
	{
		cnt = (cnt + 7) >> 3;
		return PalEntry (BlendColor.a*cnt*255/9,
			BlendColor.r, BlendColor.g, BlendColor.b);
	}
	return 0;
}